

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
WriterTest_WriteDoubleWithFilledBuffer_Test::TestBody
          (WriterTest_WriteDoubleWithFilledBuffer_Test *this)

{
  locale_ref loc;
  bool bVar1;
  char *s;
  size_t count;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  AssertionResult gtest_ar;
  string_view sv;
  int i;
  writer writer;
  memory_buffer buf;
  allocator<char> *in_stack_fffffffffffffd38;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> in_stack_fffffffffffffd50;
  basic_buffer<char> *this_00;
  int line;
  basic_string_view<char> *this_01;
  allocator<char> *paVar2;
  Type type;
  AssertHelper *in_stack_fffffffffffffd70;
  AssertionResult local_280;
  basic_string_view<char> local_270;
  int local_25c;
  locale_ref local_258;
  undefined8 local_250;
  iterator in_stack_fffffffffffffdb8;
  locale_ref in_stack_fffffffffffffdc0;
  allocator<char> local_221;
  basic_buffer<char> local_220 [17];
  
  paVar2 = &local_221;
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::allocator<char>::~allocator(&local_221);
  fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>::back_insert_range
            ((back_insert_range<fmt::v5::internal::basic_buffer<char>_> *)
             in_stack_fffffffffffffd50.container,
             (basic_buffer<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  fmt::v5::internal::locale_ref::locale_ref(&local_258);
  loc.locale_._7_1_ = in_stack_fffffffffffffd4f;
  loc.locale_._0_7_ = in_stack_fffffffffffffd48;
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  basic_writer((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
               in_stack_fffffffffffffd40,
               (back_insert_range<fmt::v5::internal::basic_buffer<char>_>)
               in_stack_fffffffffffffd50.container,loc);
  __buf = extraout_RDX;
  for (local_25c = 0; type = (Type)((ulong)paVar2 >> 0x20), local_25c < 500;
      local_25c = local_25c + 1) {
    local_250 = 0x20;
    fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
    write((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
          &stack0xfffffffffffffdb8,0x20,__buf,in_RCX);
    __buf = extraout_RDX_00;
  }
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
             &stack0xfffffffffffffdb8,(int)local_250,__buf,in_RCX);
  this_00 = local_220;
  s = fmt::v5::internal::basic_buffer<char>::data(this_00);
  count = fmt::v5::internal::basic_buffer<char>::size(this_00);
  this_01 = &local_270;
  fmt::v5::basic_string_view<char>::basic_string_view(this_01,s,count);
  fmt::v5::basic_string_view<char>::remove_prefix(this_01,500);
  testing::internal::EqHelper<false>::Compare<char[4],fmt::v5::basic_string_view<char>>
            (s,(char *)this_00,
             (char (*) [4])CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
             (basic_string_view<char> *)in_stack_fffffffffffffd40);
  line = (int)((ulong)s >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd70);
    in_stack_fffffffffffffd40 =
         (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x12bc03);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd70,type,(char *)this_01,line,(char *)this_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdc0.locale_,
               (Message *)in_stack_fffffffffffffdb8.container);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd40);
    testing::Message::~Message((Message *)0x12bc51);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12bc9d);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            (in_stack_fffffffffffffd40);
  return;
}

Assistant:

TEST(WriterTest, WriteDoubleWithFilledBuffer) {
  memory_buffer buf;
  fmt::writer writer(buf);
  // Fill the buffer.
  for (int i = 0; i < fmt::inline_buffer_size; ++i)
    writer.write(' ');
  writer.write(1.2);
  fmt::string_view sv(buf.data(), buf.size());
  sv.remove_prefix(fmt::inline_buffer_size);
  EXPECT_EQ("1.2", sv);
}